

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetFwd.c
# Opt level: O3

Aig_Man_t * Saig_ManRetimeForward(Aig_Man_t *p,int nMaxIters,int fVerbose)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p_00;
  Aig_Man_t *pAVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int nRegMoves;
  timespec ts;
  int nRegFixed;
  uint local_4c;
  timespec local_48;
  int local_38;
  uint local_34;
  
  local_4c = 1;
  p_00 = p;
  local_38 = fVerbose;
  if (0 < nMaxIters) {
    uVar6 = 1;
    pAVar3 = p;
    do {
      iVar1 = clock_gettime(3,&local_48);
      if (iVar1 < 0) {
        lVar4 = 1;
      }
      else {
        lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
        lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_48.tv_sec * -1000000;
      }
      p_00 = Saig_ManRetimeForwardOne(pAVar3,(int *)&local_34,(int *)&local_4c);
      if (local_38 != 0) {
        iVar1 = 0xa2bfab;
        printf("%2d : And = %6d. Reg = %5d. Unret = %5d. Move = %6d. ",uVar6,
               (ulong)(uint)(pAVar3->nObjs[6] + pAVar3->nObjs[5]),(ulong)(uint)pAVar3->nRegs,
               (ulong)local_34,(ulong)local_4c);
        Abc_Print(iVar1,"%s =","Time");
        iVar2 = 3;
        iVar1 = clock_gettime(3,&local_48);
        if (iVar1 < 0) {
          lVar5 = -1;
        }
        else {
          lVar5 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
        }
        Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
      }
      if (pAVar3 != p) {
        Aig_ManStop(pAVar3);
      }
    } while (((int)uVar6 < nMaxIters) &&
            (uVar6 = (ulong)((int)uVar6 + 1), pAVar3 = p_00, 0 < (int)local_4c));
  }
  iVar2 = clock_gettime(3,&local_48);
  iVar1 = local_38;
  if (iVar2 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  pAVar3 = Aig_ManReduceLaches(p_00,local_38);
  if (iVar1 != 0) {
    Abc_Print((int)p_00,"%s =","Register sharing time");
    iVar2 = 3;
    iVar1 = clock_gettime(3,&local_48);
    if (iVar1 < 0) {
      lVar5 = -1;
    }
    else {
      lVar5 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    Abc_Print(iVar2,"%9.2f sec\n",(double)(lVar5 + lVar4) / 1000000.0);
  }
  return pAVar3;
}

Assistant:

Aig_Man_t * Saig_ManRetimeForward( Aig_Man_t * p, int nMaxIters, int fVerbose )
{
    Aig_Man_t * pNew, * pTemp;
    int i, nRegFixed, nRegMoves = 1;
    abctime clk;
    pNew = p;
    for ( i = 0; i < nMaxIters && nRegMoves > 0; i++ )
    {
        clk = Abc_Clock();
        pNew = Saig_ManRetimeForwardOne( pTemp = pNew, &nRegFixed, &nRegMoves );
        if ( fVerbose )
        {
            printf( "%2d : And = %6d. Reg = %5d. Unret = %5d. Move = %6d. ", 
                i + 1, Aig_ManNodeNum(pTemp), Aig_ManRegNum(pTemp), nRegFixed, nRegMoves );
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( pTemp != p )
            Aig_ManStop( pTemp );
    }
    clk = Abc_Clock();
    pNew = Aig_ManReduceLaches( pNew, fVerbose );
    if ( fVerbose )
    {
        ABC_PRT( "Register sharing time", Abc_Clock() - clk );
    }
    return pNew;
}